

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::scrollChildren(QWidgetPrivate *this,int dx,int dy)

{
  QWidgetData *pQVar1;
  bool bVar2;
  QWidget *atopLeft;
  QObjectList *this_00;
  qsizetype qVar3;
  QWidget *this_01;
  QWidget *this_02;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QWidget *q;
  QMoveEvent e;
  QRect r;
  QPoint oldp;
  QObjectList childObjects;
  QPoint pd;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QPoint *in_stack_ffffffffffffff50;
  WidgetAttribute attribute;
  undefined4 in_stack_ffffffffffffff60;
  int iVar4;
  QPoint local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QSize local_58;
  QPoint local_50;
  QPoint local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QPoint local_30;
  QList<QObject_*> local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  atopLeft = q_func(in_RDI);
  this_00 = QObject::children((QObject *)0x35acc2);
  qVar3 = QList<QObject_*>::size(this_00);
  if (0 < qVar3) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QObject::children((QObject *)0x35ad2f);
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_ffffffffffffff50,
               (QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar4 = 0;
    while( true ) {
      this_01 = (QWidget *)(long)iVar4;
      qVar3 = QList<QObject_*>::size(&local_28);
      if (qVar3 <= (long)this_01) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)this_01,
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      this_02 = qobject_cast<QWidget*>
                          ((QObject *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
      ;
      if (this_02 != (QWidget *)0x0) {
        bVar2 = QWidget::isWindow(this_01);
        attribute = (WidgetAttribute)((ulong)this_01 >> 0x20);
        if (!bVar2) {
          local_30 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_30 = QWidget::pos(this_02);
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = QWidget::pos(this_02);
          local_48 = ::operator+((QPoint *)CONCAT44(iVar4,in_stack_ffffffffffffff60),
                                 (QPoint *)this_02);
          local_58 = QWidget::size((QWidget *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          QRect::QRect((QRect *)CONCAT44(in_ESI,in_EDX),(QPoint *)atopLeft,
                       (QSize *)CONCAT44(iVar4,in_stack_ffffffffffffff60));
          pQVar1 = this_02->data;
          *(undefined1 **)&pQVar1->crect = local_40;
          *(undefined1 **)&(pQVar1->crect).x2 = local_38;
          bVar2 = QWidget::testAttribute(this_02,attribute);
          if (bVar2) {
            QWidget::d_func((QWidget *)0x35ae6e);
            setWSGeometry((QWidgetPrivate *)CONCAT44(iVar4,in_stack_ffffffffffffff60));
          }
          QWidget::d_func((QWidget *)0x35ae80);
          setDirtyOpaqueRegion((QWidgetPrivate *)CONCAT44(iVar4,in_stack_ffffffffffffff60));
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff4c,
                                                      in_stack_ffffffffffffff48));
          QMoveEvent::QMoveEvent((QMoveEvent *)&local_78,(QPoint *)&local_80,(QPoint *)&local_30);
          QCoreApplication::sendEvent(&this_02->super_QObject,(QEvent *)&local_78);
          QMoveEvent::~QMoveEvent((QMoveEvent *)&local_78);
        }
      }
      iVar4 = iVar4 + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x35af16);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::scrollChildren(int dx, int dy)
{
    Q_Q(QWidget);
    if (q->children().size() > 0) {        // scroll children
        QPoint pd(dx, dy);
        QObjectList childObjects = q->children();
        for (int i = 0; i < childObjects.size(); ++i) { // move all children
            QWidget *w = qobject_cast<QWidget*>(childObjects.at(i));
            if (w && !w->isWindow()) {
                QPoint oldp = w->pos();
                QRect  r(w->pos() + pd, w->size());
                w->data->crect = r;
                if (w->testAttribute(Qt::WA_WState_Created))
                    w->d_func()->setWSGeometry();
                w->d_func()->setDirtyOpaqueRegion();
                QMoveEvent e(r.topLeft(), oldp);
                QCoreApplication::sendEvent(w, &e);
            }
        }
    }
}